

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O1

void __thiscall Table::load_operators(Table *this,string *fname)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  load((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&local_40,fname);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->operators)._M_t);
  if (local_40._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_40._M_impl.super__Rb_tree_header;
    (this->operators)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_40._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->operators)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_40._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->operators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_40._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->operators)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_40._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_40._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(this->operators)._M_t._M_impl.super__Rb_tree_header._M_header;
    (this->operators)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_40._M_impl.super__Rb_tree_header._M_node_count;
    local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_40._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_40._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_40);
  return;
}

Assistant:

void Table::load_operators(const std::string &fname) {
    this->operators = load(fname);
}